

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointElement.cpp
# Opt level: O0

void __thiscall iDynTree::JointElement::exitElementScope(JointElement *this)

{
  bool bVar1;
  byte bVar2;
  RevoluteJoint *this_00;
  PrismaticJoint *this_01;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  char *pcVar6;
  byte bVar7;
  long in_RDI;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::JointElement::JointInfo>,_false,_true>,_bool>
  pVar8;
  string errStr_1;
  string errStr;
  PrismaticJoint *prism_joint;
  RevoluteJoint *rev_joint;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::JointElement::JointInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::JointElement::JointInfo>_>_>
  *map;
  JointInfo info;
  RevoluteJoint *in_stack_fffffffffffffd38;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::JointElement::JointInfo>
  *in_stack_fffffffffffffd40;
  undefined6 in_stack_fffffffffffffd48;
  undefined1 in_stack_fffffffffffffd4e;
  undefined1 in_stack_fffffffffffffd4f;
  JointInfo *in_stack_fffffffffffffd50;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::JointElement::JointInfo>
  *in_stack_fffffffffffffd60;
  Transform *in_stack_fffffffffffffd68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd80;
  char *in_stack_fffffffffffffd88;
  string local_230 [32];
  string local_210 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::JointElement::JointInfo>,_true>
  local_1f0;
  byte local_1e8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::JointElement::JointInfo>,_true>
  local_140;
  byte local_138;
  string local_130 [32];
  string local_110 [48];
  PrismaticJoint *local_e0;
  RevoluteJoint *local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  __shared_ptr local_88 [16];
  Axis local_78;
  string local_48 [32];
  string local_28 [40];
  
  JointInfo::JointInfo(in_stack_fffffffffffffd50);
  std::shared_ptr<iDynTree::IJoint>::shared_ptr
            ((shared_ptr<iDynTree::IJoint> *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  std::shared_ptr<iDynTree::IJoint>::operator=
            ((shared_ptr<iDynTree::IJoint> *)in_stack_fffffffffffffd40,
             (shared_ptr<iDynTree::IJoint> *)in_stack_fffffffffffffd38);
  std::shared_ptr<iDynTree::IJoint>::~shared_ptr((shared_ptr<iDynTree::IJoint> *)0x19f669);
  local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  bVar1 = std::operator==(&in_stack_fffffffffffffd40->first,(char *)in_stack_fffffffffffffd38);
  if (bVar1) {
    std::make_shared<iDynTree::FixedJoint,iDynTree::Transform&>(in_stack_fffffffffffffd68);
    std::shared_ptr<iDynTree::IJoint>::operator=
              ((shared_ptr<iDynTree::IJoint> *)in_stack_fffffffffffffd40,
               (shared_ptr<iDynTree::FixedJoint> *)in_stack_fffffffffffffd38);
    std::shared_ptr<iDynTree::FixedJoint>::~shared_ptr((shared_ptr<iDynTree::FixedJoint> *)0x19f6e0)
    ;
    local_a0 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                (in_RDI + 0x18);
  }
  else {
    bVar1 = std::operator==(&in_stack_fffffffffffffd40->first,(char *)in_stack_fffffffffffffd38);
    if ((bVar1) ||
       (bVar1 = std::operator==(&in_stack_fffffffffffffd40->first,(char *)in_stack_fffffffffffffd38)
       , bVar1)) {
      this_00 = (RevoluteJoint *)operator_new(0x218);
      iDynTree::RevoluteJoint::RevoluteJoint(this_00);
      local_c8 = this_00;
      (**(code **)(*(long *)this_00 + 0x30))(this_00,in_RDI + 0x60);
      std::shared_ptr<iDynTree::IJoint>::shared_ptr<iDynTree::RevoluteJoint,void>
                ((shared_ptr<iDynTree::IJoint> *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38
                );
      std::shared_ptr<iDynTree::IJoint>::operator=
                ((shared_ptr<iDynTree::IJoint> *)in_stack_fffffffffffffd40,
                 (shared_ptr<iDynTree::IJoint> *)in_stack_fffffffffffffd38);
      std::shared_ptr<iDynTree::IJoint>::~shared_ptr((shared_ptr<iDynTree::IJoint> *)0x19f7e7);
      local_a0 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                  (in_RDI + 0x10);
    }
    else {
      bVar1 = std::operator==(&in_stack_fffffffffffffd40->first,(char *)in_stack_fffffffffffffd38);
      if (bVar1) {
        this_01 = (PrismaticJoint *)operator_new(0x218);
        iDynTree::PrismaticJoint::PrismaticJoint(this_01);
        local_e0 = this_01;
        (**(code **)(*(long *)this_01 + 0x30))(this_01,in_RDI + 0x60);
        std::shared_ptr<iDynTree::IJoint>::shared_ptr<iDynTree::PrismaticJoint,void>
                  ((shared_ptr<iDynTree::IJoint> *)in_stack_fffffffffffffd40,
                   (PrismaticJoint *)in_stack_fffffffffffffd38);
        std::shared_ptr<iDynTree::IJoint>::operator=
                  ((shared_ptr<iDynTree::IJoint> *)in_stack_fffffffffffffd40,
                   (shared_ptr<iDynTree::IJoint> *)in_stack_fffffffffffffd38);
        std::shared_ptr<iDynTree::IJoint>::~shared_ptr((shared_ptr<iDynTree::IJoint> *)0x19f8d5);
        local_a0 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (in_RDI + 0x10);
      }
    }
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool(local_88);
  if ((bVar1) &&
     (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    std::__cxx11::string::operator=(local_48,(string *)(in_RDI + 0xf0));
    std::__cxx11::string::operator=(local_28,(string *)(in_RDI + 0x110));
    iDynTree::Axis::operator=(&local_78,(Axis *)(in_RDI + 0xc0));
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x130));
    if (bVar1) {
      peVar4 = std::__shared_ptr_access<iDynTree::IJoint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<iDynTree::IJoint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x19f9c0);
      (**(code **)(*(long *)peVar4 + 0xd0))(peVar4,1);
      in_stack_fffffffffffffd80 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::__shared_ptr_access<iDynTree::IJoint,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<iDynTree::IJoint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x19f9e3);
      peVar3 = std::
               __shared_ptr_access<iDynTree::JointElement::Limits,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<iDynTree::JointElement::Limits,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x19fa01);
      in_stack_fffffffffffffd88 = (char *)peVar3->positionLower;
      peVar3 = std::
               __shared_ptr_access<iDynTree::JointElement::Limits,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<iDynTree::JointElement::Limits,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x19fa15);
      (**(code **)(*(long *)in_stack_fffffffffffffd80 + 0xf0))
                (in_stack_fffffffffffffd88,peVar3->positionUpper,in_stack_fffffffffffffd80,0);
    }
    else {
      bVar1 = std::operator==(&in_stack_fffffffffffffd40->first,(char *)in_stack_fffffffffffffd38);
      if ((bVar1) ||
         (bVar1 = std::operator==(&in_stack_fffffffffffffd40->first,
                                  (char *)in_stack_fffffffffffffd38), bVar1)) {
        std::operator+(in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffd4f,
                                CONCAT16(in_stack_fffffffffffffd4e,in_stack_fffffffffffffd48)),
                       (char *)in_stack_fffffffffffffd40);
        std::__cxx11::string::~string(local_130);
        pcVar6 = (char *)std::__cxx11::string::c_str();
        iDynTree::reportWarning("JointElement","",pcVar6);
        std::__cxx11::string::~string(local_110);
      }
    }
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x140));
    if (bVar1) {
      peVar4 = std::__shared_ptr_access<iDynTree::IJoint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<iDynTree::IJoint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x19fb88);
      (**(code **)(*(long *)peVar4 + 0x100))(peVar4,1);
      peVar4 = std::__shared_ptr_access<iDynTree::IJoint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<iDynTree::IJoint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x19fbab);
      peVar5 = std::
               __shared_ptr_access<iDynTree::JointElement::JointDynamicsParams,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<iDynTree::JointElement::JointDynamicsParams,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x19fbc4);
      (**(code **)(*(long *)peVar4 + 0x108))(peVar5->damping,peVar4,0);
      in_stack_fffffffffffffd60 =
           (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::JointElement::JointInfo>
            *)std::__shared_ptr_access<iDynTree::IJoint,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<iDynTree::IJoint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x19fbed);
      peVar5 = std::
               __shared_ptr_access<iDynTree::JointElement::JointDynamicsParams,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<iDynTree::JointElement::JointDynamicsParams,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x19fc06);
      (**(code **)(*(long *)&in_stack_fffffffffffffd60->first + 0x110))
                (peVar5->staticFriction,in_stack_fffffffffffffd60,0);
    }
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::JointElement::JointInfo>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_iDynTree::JointElement::JointInfo_&,_true>
              (in_stack_fffffffffffffd60,local_a0,in_stack_fffffffffffffd50);
    pVar8 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::JointElement::JointInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::JointElement::JointInfo>_>_>
            ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::JointElement::JointInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::JointElement::JointInfo>_>_>
                      *)in_stack_fffffffffffffd50,
                     (value_type *)
                     CONCAT17(in_stack_fffffffffffffd4f,
                              CONCAT16(in_stack_fffffffffffffd4e,in_stack_fffffffffffffd48)));
    local_1f0._M_cur =
         (__node_type *)
         pVar8.first.
         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::JointElement::JointInfo>,_true>
         ._M_cur;
    bVar7 = pVar8.second;
    bVar2 = bVar7 ^ 0xff;
    local_1e8 = bVar7;
    local_140._M_cur = local_1f0._M_cur;
    local_138 = bVar7;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::JointElement::JointInfo>
    ::~pair(in_stack_fffffffffffffd40);
    if ((bVar2 & 1) != 0) {
      std::operator+(in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(bVar7,CONCAT16(bVar2,in_stack_fffffffffffffd48)),
                     (char *)in_stack_fffffffffffffd40);
      std::__cxx11::string::~string(local_230);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      iDynTree::reportError("JointElement","",pcVar6);
      in_stack_fffffffffffffd40 =
           (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::JointElement::JointInfo>
            *)iDynTree::XMLElement::getParserState();
      iDynTree::XMLParserState::setParsingError();
      std::__cxx11::string::~string(local_210);
    }
  }
  JointInfo::~JointInfo((JointInfo *)in_stack_fffffffffffffd40);
  return;
}

Assistant:

void JointElement::exitElementScope()
    {
        JointElement::JointInfo info;
        info.joint = nullptr;
        std::unordered_map<std::string, JointElement::JointInfo>* map = nullptr;
        
        if (m_jointType == "fixed")
        {
            info.joint = std::make_shared<FixedJoint>(m_jointFrame);
            map = &m_fixedJoints;
        }
        else if (m_jointType == "revolute" || m_jointType == "continuous")
        {
            RevoluteJoint* rev_joint = new RevoluteJoint();
            rev_joint->setRestTransform(m_jointFrame);
            info.joint = std::shared_ptr<IJoint>(rev_joint);
            map = &m_joints;
        }
        else if (m_jointType == "prismatic")
        {
            PrismaticJoint* prism_joint = new PrismaticJoint();
            prism_joint->setRestTransform(m_jointFrame);
            info.joint = std::shared_ptr<IJoint>(prism_joint);
            map = &m_joints;
        }

        if (info.joint && map) {
            info.parentLinkName = m_parentLink;
            info.childLinkName = m_childLink;
            info.axis = m_axis;

            if (m_limits) {
                // Limits found
                info.joint->enablePosLimits(true);
                info.joint->setPosLimits(0, m_limits->positionLower, m_limits->positionUpper);
            } else if (m_jointType == "revolute" || m_jointType == "prismatic") {
                std::string errStr = "Joint " + m_jointName + " misses the limit tag.";
                reportWarning("JointElement", "", errStr.c_str());
            }

            if(m_dynamic_params) {
                info.joint->setJointDynamicsType(URDFJointDynamics);
                info.joint->setDamping(0, m_dynamic_params->damping);
                info.joint->setStaticFriction(0, m_dynamic_params->staticFriction);
            }

            if (!map->insert(std::unordered_map<std::string, JointElement::JointInfo>::value_type(m_jointName, info)).second) {
                std::string errStr = "Duplicate joint " + m_jointName + " found.";
                reportError("JointElement", "", errStr.c_str());
                getParserState().setParsingError();
            }
        }
    }